

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O3

void __thiscall IPAsirMiniSAT::add(IPAsirMiniSAT *this,int lit)

{
  vec<Minisat::Lit> *copy;
  Lit local_24;
  
  if (this->fmap != (uchar *)0x0) {
    operator_delete__(this->fmap);
    this->fmap = (uchar *)0x0;
    this->szfmap = 0;
  }
  this->nomodel = true;
  if (lit == 0) {
    copy = &(this->super_SimpSolver).super_Solver.add_tmp;
    Minisat::vec<Minisat::Lit>::copyTo(&this->clause,copy);
    Minisat::SimpSolver::addClause_(&this->super_SimpSolver,copy);
    if ((this->clause).data != (Lit *)0x0) {
      (this->clause).sz = 0;
    }
  }
  else {
    import(this,lit);
    Minisat::vec<Minisat::Lit>::push(&this->clause,&local_24);
  }
  return;
}

Assistant:

void add(int lit)
    {
        reset();
        nomodel = true;
        if (lit)
            clause.push(import(lit));
        else
            addClause(clause), clause.clear();
    }